

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_or_reference.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  CAR myCar;
  char *local_78;
  long local_70;
  char local_68 [16];
  CAR local_58;
  CAR local_38;
  
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"blue","");
  paVar1 = &local_58.color.field_2;
  local_58.color._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_78,local_78 + local_70);
  setRed(&local_38,&local_58);
  std::__cxx11::string::operator=((string *)&local_78,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.color._M_dataplus._M_p != &local_38.color.field_2) {
    operator_delete(local_38.color._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.color._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.color._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"myCar color : ",0xe);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_78,local_70);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  return 0;
}

Assistant:

int main()
{
    CAR myCar = { "blue" };
    myCar = setRed(myCar);
    std::cout << "myCar color : " << myCar.color << std::endl;

    return 0;
}